

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O3

void opensshcert_signature_preimage(opensshcert_key *ck,BinarySink *bs)

{
  ptrlen pl;
  ptrlen pl_00;
  ptrlen pl_01;
  ptrlen pl_02;
  ptrlen pl_03;
  ptrlen pl_04;
  ptrlen pl_05;
  strbuf *buf_o;
  BinarySource src [1];
  BinarySource local_48;
  
  BinarySink_put_stringz(bs->binarysink_,*(char **)((long)((ck->sshk).vt)->extra + 0x30));
  pl.ptr = ck->nonce->u;
  pl.len = ck->nonce->len;
  BinarySink_put_stringpl(bs->binarysink_,pl);
  buf_o = strbuf_new();
  (*ck->basekey->vt->public_blob)(ck->basekey,buf_o->binarysink_);
  local_48.data = buf_o->u;
  local_48.len = buf_o->len;
  local_48.pos = 0;
  local_48.err = BSE_NO_ERROR;
  local_48.binarysource_ = &local_48;
  BinarySource_get_string(&local_48);
  BinarySink_put_data(bs->binarysink_,
                      (void *)((long)(local_48.binarysource_)->data + (local_48.binarysource_)->pos)
                      ,(local_48.binarysource_)->len - (local_48.binarysource_)->pos);
  strbuf_free(buf_o);
  BinarySink_put_uint64(bs->binarysink_,ck->serial);
  BinarySink_put_uint32(bs->binarysink_,(ulong)ck->type);
  pl_00.ptr = ck->key_id->u;
  pl_00.len = ck->key_id->len;
  BinarySink_put_stringpl(bs->binarysink_,pl_00);
  pl_01.ptr = ck->valid_principals->u;
  pl_01.len = ck->valid_principals->len;
  BinarySink_put_stringpl(bs->binarysink_,pl_01);
  BinarySink_put_uint64(bs->binarysink_,ck->valid_after);
  BinarySink_put_uint64(bs->binarysink_,ck->valid_before);
  pl_02.ptr = ck->critical_options->u;
  pl_02.len = ck->critical_options->len;
  BinarySink_put_stringpl(bs->binarysink_,pl_02);
  pl_03.ptr = ck->extensions->u;
  pl_03.len = ck->extensions->len;
  BinarySink_put_stringpl(bs->binarysink_,pl_03);
  pl_04.ptr = ck->reserved->u;
  pl_04.len = ck->reserved->len;
  BinarySink_put_stringpl(bs->binarysink_,pl_04);
  pl_05.ptr = ck->signature_key->u;
  pl_05.len = ck->signature_key->len;
  BinarySink_put_stringpl(bs->binarysink_,pl_05);
  return;
}

Assistant:

static void opensshcert_signature_preimage(opensshcert_key *ck, BinarySink *bs)
{
    const opensshcert_extra *extra = ck->sshk.vt->extra;
    put_stringz(bs, extra->cert_key_ssh_id);
    put_stringpl(bs, ptrlen_from_strbuf(ck->nonce));

    strbuf *basepub = strbuf_new();
    ssh_key_public_blob(ck->basekey, BinarySink_UPCAST(basepub));
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(basepub));
    get_string(src); /* skip initial key type string */
    put_data(bs, get_ptr(src), get_avail(src));
    strbuf_free(basepub);

    put_uint64(bs, ck->serial);
    put_uint32(bs, ck->type);
    put_stringpl(bs, ptrlen_from_strbuf(ck->key_id));
    put_stringpl(bs, ptrlen_from_strbuf(ck->valid_principals));
    put_uint64(bs, ck->valid_after);
    put_uint64(bs, ck->valid_before);
    put_stringpl(bs, ptrlen_from_strbuf(ck->critical_options));
    put_stringpl(bs, ptrlen_from_strbuf(ck->extensions));
    put_stringpl(bs, ptrlen_from_strbuf(ck->reserved));
    put_stringpl(bs, ptrlen_from_strbuf(ck->signature_key));
}